

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_from_memory
                    (nk_font_atlas *atlas,void *memory,nk_size size,float height,
                    nk_font_config *config)

{
  nk_font *pnVar1;
  long lVar2;
  nk_font_config *pnVar3;
  nk_font_config cfg;
  nk_font_config local_70;
  
  if (atlas == (nk_font_atlas *)0x0) {
    return (nk_font *)0x0;
  }
  if ((atlas->temporary).alloc != (nk_plugin_alloc)0x0) {
    if (size == 0) {
      return (nk_font *)0x0;
    }
    if (memory == (void *)0x0) {
      return (nk_font *)0x0;
    }
    if ((atlas->temporary).free == (nk_plugin_free)0x0) {
      return (nk_font *)0x0;
    }
    if (((atlas->permanent).alloc != (nk_plugin_alloc)0x0) &&
       ((atlas->permanent).free != (nk_plugin_free)0x0)) {
      if (config == (nk_font_config *)0x0) {
        nk_font_config(&local_70,height);
      }
      else {
        pnVar3 = &local_70;
        for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
          pnVar3->next = config->next;
          config = (nk_font_config *)&config->ttf_blob;
          pnVar3 = (nk_font_config *)&pnVar3->ttf_blob;
        }
      }
      local_70.ttf_data_owned_by_atlas = '\0';
      local_70.ttf_blob = memory;
      local_70.ttf_size = size;
      local_70.size = height;
      pnVar1 = nk_font_atlas_add(atlas,&local_70);
      return pnVar1;
    }
  }
  return (nk_font *)0x0;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_memory(struct nk_font_atlas *atlas, void *memory,
nk_size size, float height, const struct nk_font_config *config)
{
struct nk_font_config cfg;
NK_ASSERT(memory);
NK_ASSERT(size);

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);
if (!atlas || !atlas->temporary.alloc || !atlas->temporary.free || !memory || !size ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 0;
return nk_font_atlas_add(atlas, &cfg);
}